

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pollwrap.c
# Opt level: O0

void pollwrap_get_fd_events_revents(pollwrapper *pw,int fd,int *events_p,int *revents_p)

{
  void *pvVar1;
  int local_48;
  int local_44;
  int revents;
  int events;
  pollwrap_fdtopos f2p_find;
  pollwrap_fdtopos *f2p;
  int *revents_p_local;
  int *events_p_local;
  int fd_local;
  pollwrapper *pw_local;
  
  local_44 = 0;
  local_48 = 0;
  if (-1 < fd) {
    revents = fd;
    pvVar1 = find234(pw->fdtopos,&revents,(cmpfn234)0x0);
    if (pvVar1 != (void *)0x0) {
      local_44 = (int)pw->fds[*(long *)((long)pvVar1 + 8)].events;
      local_48 = (int)pw->fds[*(long *)((long)pvVar1 + 8)].revents;
    }
    if (events_p != (int *)0x0) {
      *events_p = local_44;
    }
    if (revents_p != (int *)0x0) {
      *revents_p = local_48;
    }
    return;
  }
  __assert_fail("fd >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/utils/pollwrap.c"
                ,0x9c,"void pollwrap_get_fd_events_revents(pollwrapper *, int, int *, int *)");
}

Assistant:

static void pollwrap_get_fd_events_revents(pollwrapper *pw, int fd,
                                           int *events_p, int *revents_p)
{
    pollwrap_fdtopos *f2p, f2p_find;
    int events = 0, revents = 0;

    assert(fd >= 0);

    f2p_find.fd = fd;
    f2p = find234(pw->fdtopos, &f2p_find, NULL);
    if (f2p) {
        events = pw->fds[f2p->pos].events;
        revents = pw->fds[f2p->pos].revents;
    }

    if (events_p)
        *events_p = events;
    if (revents_p)
        *revents_p = revents;
}